

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::TrimWhitespace(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  
  pcVar4 = (s->_M_dataplus)._M_p;
  sVar1 = s->_M_string_length;
  sVar5 = sVar1;
  pcVar6 = pcVar4;
  if (sVar1 == 0) {
LAB_001312dc:
    pcVar2 = pcVar4 + sVar1;
    if (pcVar6 != pcVar4 + sVar1) {
      do {
        pcVar4 = pcVar2;
        if (pcVar4[-1] < '\0') break;
        iVar3 = isspace((int)pcVar4[-1]);
        pcVar2 = pcVar4 + -1;
      } while (iVar3 != 0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)__return_storage_ptr__,pcVar6,pcVar4);
      return __return_storage_ptr__;
    }
  }
  else {
    do {
      if ((*pcVar6 < '\0') || (iVar3 = isspace((int)*pcVar6), iVar3 == 0)) goto LAB_001312dc;
      sVar5 = sVar5 - 1;
      pcVar6 = pcVar6 + 1;
    } while (sVar5 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while (start != s.end() && cm_isspace(*start))
    ++start;
  if (start == s.end())
    return "";

  std::string::const_iterator stop = s.end()-1;
  while (cm_isspace(*stop))
    --stop;
  return std::string(start, stop+1);
}